

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void free_obj_index(OBJ_INDEX_DATA *pObj)

{
  AFFECT_DATA *af;
  EXTRA_DESCR_DATA *ed;
  
  free_pstring(pObj->name);
  free_pstring(pObj->short_descr);
  free_pstring(pObj->description);
  af = (AFFECT_DATA *)&pObj->affected;
  while (af = af->next, af != (AFFECT_DATA *)0x0) {
    free_affect(af);
  }
  ed = (EXTRA_DESCR_DATA *)&pObj->extra_descr;
  while (ed = ed->next, ed != (EXTRA_DESCR_DATA *)0x0) {
    free_extra_descr(ed);
  }
  pObj->next = obj_index_free;
  obj_index_free = pObj;
  return;
}

Assistant:

void free_obj_index(OBJ_INDEX_DATA *pObj)
{
	EXTRA_DESCR_DATA *pExtra;
	AFFECT_DATA *pAf;

	free_pstring(pObj->name);
	free_pstring(pObj->short_descr);
	free_pstring(pObj->description);

	for (pAf = pObj->affected; pAf; pAf = pAf->next)
	{
		free_affect(pAf);
	}

	for (pExtra = pObj->extra_descr; pExtra; pExtra = pExtra->next)
	{
		free_extra_descr(pExtra);
	}

	pObj->next = obj_index_free;
	obj_index_free = pObj;
}